

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O0

MPP_RET process_pps(H264_SLICE_t *currSlice)

{
  h264d_cur_ctx_t *cur_sps;
  h264_pps_t *cur_pps_00;
  h264_pps_t *phVar1;
  H264_PPS_t *cur_pps;
  BitReadCtx_t *p_bitctx;
  H264dCurCtx_t *p_Cur;
  MPP_RET ret;
  H264_SLICE_t *currSlice_local;
  
  cur_sps = currSlice->p_Cur;
  cur_pps_00 = &cur_sps->pps;
  reset_curpps_data(cur_pps_00);
  currSlice_local._4_4_ = parser_pps(&cur_sps->bitctx,&cur_sps->sps,cur_pps_00);
  if (currSlice_local._4_4_ < MPP_OK) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_pps","Function error(%d).\n",(char *)0x0,0x8c);
    }
  }
  else {
    if ((((h264d_debug & 2) != 0) && (cur_pps_00->Valid != 1)) &&
       (_mpp_log_l(2,"h264d_pps","Assertion %s failed at %s:%d\n",(char *)0x0,"cur_pps->Valid == 1",
                   "process_pps",0x8e), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (currSlice->p_Vid->ppsSet[(cur_sps->pps).pic_parameter_set_id] == (h264_pps_t *)0x0) {
      phVar1 = (h264_pps_t *)mpp_osal_calloc("process_pps",0x8b8);
      currSlice->p_Vid->ppsSet[(cur_sps->pps).pic_parameter_set_id] = phVar1;
    }
    memcpy(currSlice->p_Vid->ppsSet[(cur_sps->pps).pic_parameter_set_id],cur_pps_00,0x8b8);
    cur_sps->p_Vid->spspps_update = 1;
    currSlice_local._4_4_ = MPP_OK;
  }
  return currSlice_local._4_4_;
}

Assistant:

MPP_RET process_pps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PPS_t *cur_pps = &p_Cur->pps;

    reset_curpps_data(cur_pps);// reset

    FUN_CHECK(ret = parser_pps(p_bitctx, &p_Cur->sps, cur_pps));
    //!< MakePPSavailable
    ASSERT(cur_pps->Valid == 1);
    if (!currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id]) {
        currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id] = mpp_calloc(H264_PPS_t, 1);
    }

    memcpy(currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id], cur_pps, sizeof(H264_PPS_t));
    p_Cur->p_Vid->spspps_update = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}